

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O1

vec3 __thiscall fw::FreeCamera::getWorldRightDirection(FreeCamera *this)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  vec3 vVar7;
  
  vVar7 = getWorldForwardDirection(this);
  uVar1 = *(undefined8 *)&(this->_upDirection).field_0;
  fVar2 = (this->_upDirection).field_0.field_0.z;
  fVar6 = (float)uVar1;
  fVar3 = (float)((ulong)uVar1 >> 0x20);
  fVar5 = vVar7.field_0._4_4_ * fVar2 - vVar7.field_0._8_4_ * fVar3;
  fVar4 = vVar7.field_0._8_4_ * fVar6 - fVar2 * vVar7.field_0._0_4_;
  fVar6 = fVar3 * vVar7.field_0._0_4_ - vVar7.field_0._4_4_ * fVar6;
  fVar2 = fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = 1.0 / fVar2;
  vVar7.field_0._8_4_ = fVar2 * fVar6;
  vVar7.field_0.field_0.y = fVar4 * fVar2;
  vVar7.field_0.field_0.x = fVar5 * fVar2;
  return (vec3)vVar7.field_0;
}

Assistant:

glm::vec3 FreeCamera::getWorldRightDirection() const
{
    return glm::normalize(
        glm::cross(getWorldForwardDirection(), getWorldUpDirection())
    );
}